

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_list(lyout *out,lys_node *node,int *first)

{
  char *val;
  lys_module *plVar1;
  char *pcVar2;
  lys_node_list *list;
  uint8_t i;
  int *first_local;
  lys_node *node_local;
  lyout *out_local;
  
  pcVar2 = node->name;
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,pcVar2,"nodetype",val,0,first);
  plVar1 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar1->name);
  if ((*(ushort *)&node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  jsons_print_config(out,node->flags,(int *)0x0);
  jsons_print_ordering(out,node->flags,(int *)0x0);
  if (*(int *)&node[1].iffeature != 0) {
    jsons_print_min(out,*(uint32_t *)&node[1].iffeature,(int *)0x0);
  }
  if (*(int *)((long)&node[1].iffeature + 4) != 0) {
    jsons_print_max(out,*(uint32_t *)((long)&node[1].iffeature + 4),(int *)0x0);
  }
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_when(out,(lys_when *)node[1].name,(int *)0x0);
  jsons_print_musts(out,(lys_restr *)node[1].dsc,node->padding[0],(int *)0x0);
  ly_print(out,",\"keys\":[");
  for (list._7_1_ = 0; list._7_1_ < node->padding[2]; list._7_1_ = list._7_1_ + 1) {
    pcVar2 = "";
    if (list._7_1_ != 0) {
      pcVar2 = ",";
    }
    ly_print(out,"%s\"%s\"",pcVar2,
             **(undefined8 **)(*(long *)&node[1].flags + (ulong)list._7_1_ * 8));
  }
  ly_print(out,"]");
  jsons_print_uniques(out,(lys_unique *)node[1].ext,node->padding[3],(int *)0x0);
  jsons_print_typedefs(out,(lys_tpdf *)node[1].ref,node->padding[1],(int *)0x0);
  jsons_print_groupings(out,node->child,(int *)0x0);
  jsons_print_data(out,node->module,node->child,(int *)0x0);
  jsons_print_actions(out,node->child,(int *)0x0);
  jsons_print_notifs(out,node->child,(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_list(struct lyout *out, const struct lys_node *node, int *first)
{
    uint8_t i;
    struct lys_node_list *list = (struct lys_node_list *)node;

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", list->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", list->ref, 1, NULL);
    jsons_print_status(out, list->flags, NULL);
    jsons_print_config(out, list->flags, NULL);
    jsons_print_ordering(out, list->flags, NULL);
    if (list->min) {
        jsons_print_min(out, list->min, NULL);
    }
    if (list->max) {
        jsons_print_max(out, list->max, NULL);
    }
    jsons_print_iffeatures(out, list->module, list->iffeature, list->iffeature_size, NULL);
    jsons_print_when(out, list->when, NULL);
    jsons_print_musts(out, list->must, list->must_size, NULL);
    ly_print(out, ",\"keys\":[");
    for (i = 0; i < list->keys_size; ++i) {
        ly_print(out, "%s\"%s\"", i ? "," : "", list->keys[i]->name);
    }
    ly_print(out, "]");
    jsons_print_uniques(out, list->unique, list->unique_size, NULL);
    jsons_print_typedefs(out, list->tpdf, list->tpdf_size, NULL);

    jsons_print_groupings(out, list->child, NULL);
    jsons_print_data(out, list->module, list->child, NULL);
    jsons_print_actions(out, list->child, NULL);
    jsons_print_notifs(out, list->child, NULL);
    ly_print(out, "}");
}